

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O2

size_t __thiscall
juzzlin::Argengine::Impl::processDefinitionMatch
          (Impl *this,OptionDefinitionSP *match,ArgumentVector *tokens,size_t currentIndex,
          bool dryRun)

{
  element_type *peVar1;
  const_reference pvVar2;
  OptionDefinition *existing;
  OptionDefinitionSP innerMatch;
  value_type value;
  undefined1 local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [32];
  
  existing = (match->
             super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  if ((existing->valuelessCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
    if ((existing->singleStringCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      return currentIndex;
    }
    currentIndex = currentIndex + 1;
    if ((ulong)((long)(tokens->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(tokens->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= currentIndex) {
      throwNoValueError(this,existing);
    }
    if (dryRun) goto LAB_00112e3e;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(tokens,currentIndex);
    std::__cxx11::string::string(local_48,(string *)pvVar2);
    getOptionDefinition((Impl *)local_78,(string *)this);
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      throwNoValueError(this,(match->
                             super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    std::__cxx11::string::~string(local_48);
    peVar1 = (match->
             super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(tokens,currentIndex);
    std::__cxx11::string::string((string *)(local_78 + 0x10),(string *)pvVar2);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(&peVar1->singleStringCallback,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_78 + 0x10));
    std::__cxx11::string::~string((string *)(local_78 + 0x10));
  }
  else {
    if (dryRun) goto LAB_00112e3e;
    std::function<void_()>::operator()(&existing->valuelessCallback);
  }
  existing = (match->
             super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
LAB_00112e3e:
  existing->applied = true;
  return currentIndex;
}

Assistant:

size_t processDefinitionMatch(OptionDefinitionSP match, const ArgumentVector & tokens, size_t currentIndex, bool dryRun) const
    {
        if (match->valuelessCallback) {
            if (!dryRun) {
                match->valuelessCallback();
            }
            match->applied = true;
        } else if (match->singleStringCallback) {
            if (++currentIndex < tokens.size()) {
                if (!dryRun) {
                    if (const auto value = tokens.at(currentIndex); const auto innerMatch = getOptionDefinition(value)) {
                        throwNoValueError(*match);
                    }
                    match->singleStringCallback(tokens.at(currentIndex));
                }
                match->applied = true;
            } else {
                throwNoValueError(*match);
            }
        }
        return currentIndex;
    }